

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void do_cmd_wiz_increase_exp(command *cmd)

{
  wchar_t wVar1;
  wchar_t n;
  
  wVar1 = cmd_get_arg_number((command_conflict *)cmd,"quantity",&n);
  if (wVar1 != L'\0') {
    n = get_quantity("Gain how much experience? ",L'✏');
    cmd_set_arg_number((command_conflict *)cmd,"quantity",n);
  }
  if (n < L'\x01') {
    n = L'\x01';
  }
  player_exp_gain(player,n);
  return;
}

Assistant:

void do_cmd_wiz_increase_exp(struct command *cmd)
{
	int n;

	if (cmd_get_arg_number(cmd, "quantity", &n) != CMD_OK) {
		n = get_quantity("Gain how much experience? ", 9999);
		cmd_set_arg_number(cmd, "quantity", n);
	}

	if (n < 1) n = 1;
	player_exp_gain(player, n);
}